

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Expr * sqlite3ExprAnd(Parse *pParse,Expr *pLeft,Expr *pRight)

{
  sqlite3 *db_00;
  sqlite3 *db;
  Expr *pRight_local;
  Expr *pLeft_local;
  Parse *pParse_local;
  
  db_00 = pParse->db;
  pParse_local = (Parse *)pRight;
  if ((pLeft != (Expr *)0x0) && (pParse_local = (Parse *)pLeft, pRight != (Expr *)0x0)) {
    if (((pLeft->flags & 0x20000001) == 0x20000000) || ((pRight->flags & 0x20000001) == 0x20000000))
    {
      sqlite3ExprUnmapAndDelete(pParse,pLeft);
      sqlite3ExprUnmapAndDelete(pParse,pRight);
      pParse_local = (Parse *)sqlite3ExprAlloc(db_00,0x93,sqlite3IntTokens,0);
    }
    else {
      pParse_local = (Parse *)sqlite3PExpr(pParse,0x2c,pLeft,pRight);
    }
  }
  return (Expr *)pParse_local;
}

Assistant:

SQLITE_PRIVATE Expr *sqlite3ExprAnd(Parse *pParse, Expr *pLeft, Expr *pRight){
  sqlite3 *db = pParse->db;
  if( pLeft==0  ){
    return pRight;
  }else if( pRight==0 ){
    return pLeft;
  }else if( ExprAlwaysFalse(pLeft) || ExprAlwaysFalse(pRight) ){
    sqlite3ExprUnmapAndDelete(pParse, pLeft);
    sqlite3ExprUnmapAndDelete(pParse, pRight);
    return sqlite3ExprAlloc(db, TK_INTEGER, &sqlite3IntTokens[0], 0);
  }else{
    return sqlite3PExpr(pParse, TK_AND, pLeft, pRight);
  }
}